

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall wabt::anon_unknown_78::BinaryReaderIR::OnEndExpr(BinaryReaderIR *this)

{
  Result RVar1;
  IfExpr *pIVar2;
  Expr *expr;
  LabelNode *label;
  Location local_30;
  
  RVar1 = TopLabelExpr(this,&label,&expr);
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  switch(label->label_type) {
  case Block:
    GetLocation(&local_30,this);
    pIVar2 = (IfExpr *)cast<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Expr>(expr);
    break;
  case Loop:
    GetLocation(&local_30,this);
    pIVar2 = (IfExpr *)cast<wabt::BlockExprBase<(wabt::ExprType)26>,wabt::Expr>(expr);
    break;
  case If:
    GetLocation(&local_30,this);
    pIVar2 = cast<wabt::IfExpr,wabt::Expr>(expr);
    break;
  case Else:
    GetLocation(&local_30,this);
    pIVar2 = cast<wabt::IfExpr,wabt::Expr>(expr);
    (pIVar2->false_end_loc).filename.data_ = local_30.filename.data_;
    (pIVar2->false_end_loc).filename.size_ = local_30.filename.size_;
    (pIVar2->false_end_loc).field_1.field_1.offset = (size_t)local_30.field_1.field_1.offset;
    *(undefined8 *)((long)&(pIVar2->false_end_loc).field_1 + 8) = local_30.field_1._8_8_;
    goto switchD_002688c5_default;
  case Try:
    GetLocation(&local_30,this);
    pIVar2 = (IfExpr *)cast<wabt::TryExpr,wabt::Expr>(expr);
    break;
  default:
    goto switchD_002688c5_default;
  }
  (pIVar2->true_).end_loc.filename.data_ = local_30.filename.data_;
  (pIVar2->true_).end_loc.filename.size_ = local_30.filename.size_;
  (pIVar2->true_).end_loc.field_1.field_1.offset = (size_t)local_30.field_1.field_1.offset;
  *(undefined8 *)((long)&(pIVar2->true_).end_loc.field_1 + 8) = local_30.field_1._8_8_;
switchD_002688c5_default:
  RVar1 = PopLabel(this);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnEndExpr() {
  LabelNode* label;
  Expr* expr;
  CHECK_RESULT(TopLabelExpr(&label, &expr));
  switch (label->label_type) {
    case LabelType::Block:
      cast<BlockExpr>(expr)->block.end_loc = GetLocation();
      break;
    case LabelType::Loop:
      cast<LoopExpr>(expr)->block.end_loc = GetLocation();
      break;
    case LabelType::If:
      cast<IfExpr>(expr)->true_.end_loc = GetLocation();
      break;
    case LabelType::Else:
      cast<IfExpr>(expr)->false_end_loc = GetLocation();
      break;
    case LabelType::Try:
      cast<TryExpr>(expr)->block.end_loc = GetLocation();
      break;

    case LabelType::Func:
    case LabelType::Catch:
      break;
  }

  return PopLabel();
}